

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

void __thiscall psy::C::Lexer::lexBackslash(Lexer *this,SyntaxKind syntaxK)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  
  yyinput(this);
  bVar1 = this->yychar_;
  uVar3 = (uint)bVar1;
  if ((bVar1 != 0) && (iVar2 = isspace((uint)bVar1), iVar2 == 0)) {
    yyinput(this);
    return;
  }
  while ((char)uVar3 != '\n') {
    iVar2 = isspace(uVar3);
    if (iVar2 == 0) {
      if ((char)uVar3 != '\0') {
        return;
      }
      this->syntaxK_splitTk = syntaxK;
      this->withinLogicalLine_ = true;
      return;
    }
    yyinput(this);
    uVar3 = (uint)this->yychar_;
  }
  do {
    yyinput(this);
    uVar3 = (uint)this->yychar_;
    if (uVar3 == 10) {
      return;
    }
    iVar2 = isspace(uVar3);
  } while (iVar2 != 0);
  if (uVar3 == 0) {
    this->syntaxK_splitTk = syntaxK;
  }
  return;
}

Assistant:

void Lexer::lexBackslash(SyntaxKind syntaxK)
{
    yyinput();
    if (yychar_ && !std::isspace(yychar_)) {
        yyinput();
        return;
    }

    while (yychar_ != '\n' && std::isspace(yychar_))
        yyinput();

    if (!yychar_) {
        syntaxK_splitTk = syntaxK;
        withinLogicalLine_ = true;
        return;
    }

    if (yychar_ == '\n') {
        yyinput();
        while (yychar_ != '\n' && std::isspace(yychar_))
            yyinput();

        if (!yychar_)
            syntaxK_splitTk = syntaxK;
    }
}